

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_result ma_data_converter_get_expected_output_frame_count
                    (ma_data_converter *pConverter,ma_uint64 inputFrameCount,
                    ma_uint64 *pOutputFrameCount)

{
  ma_resampling_backend_vtable *pmVar1;
  _func_ma_result_void_ptr_ma_resampling_backend_ptr_ma_uint64_ma_uint64_ptr *UNRECOVERED_JUMPTABLE;
  ma_result mVar2;
  
  mVar2 = MA_INVALID_ARGS;
  if ((pOutputFrameCount != (ma_uint64 *)0x0) &&
     (*pOutputFrameCount = 0, pConverter != (ma_data_converter *)0x0)) {
    if (pConverter->hasResampler == '\0') {
      *pOutputFrameCount = inputFrameCount;
      mVar2 = MA_SUCCESS;
    }
    else {
      pmVar1 = (pConverter->resampler).pBackendVTable;
      mVar2 = MA_NOT_IMPLEMENTED;
      if ((pmVar1 != (ma_resampling_backend_vtable *)0x0) &&
         (UNRECOVERED_JUMPTABLE = pmVar1->onGetExpectedOutputFrameCount,
         UNRECOVERED_JUMPTABLE !=
         (_func_ma_result_void_ptr_ma_resampling_backend_ptr_ma_uint64_ma_uint64_ptr *)0x0)) {
        mVar2 = (*UNRECOVERED_JUMPTABLE)
                          ((pConverter->resampler).pBackendUserData,(pConverter->resampler).pBackend
                           ,inputFrameCount,pOutputFrameCount);
        return mVar2;
      }
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_data_converter_get_expected_output_frame_count(const ma_data_converter* pConverter, ma_uint64 inputFrameCount, ma_uint64* pOutputFrameCount)
{
    if (pOutputFrameCount == NULL) {
        return MA_INVALID_ARGS;
    }

    *pOutputFrameCount = 0;

    if (pConverter == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pConverter->hasResampler) {
        return ma_resampler_get_expected_output_frame_count(&pConverter->resampler, inputFrameCount, pOutputFrameCount);
    } else {
        *pOutputFrameCount = inputFrameCount;   /* 1:1 */
        return MA_SUCCESS;
    }
}